

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void do_detect_movement(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  CHAR_DATA *in_RDI;
  int number;
  AFFECT_DATA af;
  AFFECT_DATA *paf;
  CHAR_DATA *in_stack_ffffffffffffff88;
  char_data *in_stack_ffffffffffffff90;
  
  bVar1 = is_affected(in_RDI,(int)gsn_detect_movement);
  if (bVar1) {
    send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    iVar2 = get_skill(ch,argument._4_4_);
    if (iVar2 != 0) {
      iVar3 = (int)in_RDI->level;
      paf = (AFFECT_DATA *)(skill_table + gsn_detect_movement);
      this = char_data::Class(in_stack_ffffffffffffff90);
      iVar4 = CClass::GetIndex(this);
      if (*(short *)((long)paf->bitvector + (long)iVar4 * 2 + -0x20) <= iVar3) {
        iVar4 = number_percent();
        if (iVar2 < iVar4) {
          check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                        af.tick_fun._4_4_);
        }
        else {
          init_affect((AFFECT_DATA *)0x615308);
          affect_to_char((CHAR_DATA *)CONCAT44(iVar2,iVar3),paf);
          check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                        af.tick_fun._4_4_);
        }
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        return;
      }
    }
    send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void do_detect_movement(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int number;

	if (is_affected(ch, gsn_detect_movement))
	{
		send_to_char("You are already listening closely.\n\r", ch);
		return;
	}

	number = get_skill(ch, gsn_detect_movement);

	if (number == 0
		|| ch->level < skill_table[gsn_detect_movement].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (number_percent() > number)
	{
		check_improve(ch, gsn_detect_movement, false, 2);
	}
	else
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_INVIS;
		af.type = gsn_detect_movement;
		af.level = ch->level;
		af.duration = ch->level;
		af.location = ch->level / 2;
		af.location = APPLY_NONE;
		af.modifier = 0;
		af.mod_name = MOD_PERCEPTION;
		affect_to_char(ch, &af);

		check_improve(ch, gsn_detect_movement, true, 2);
	}

	send_to_char("You listen intently to your surroundings.\n\r", ch);
}